

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_read_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,
              void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  void *array_00;
  void *nullval_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_R8D;
  long in_stack_00000010;
  undefined4 *in_stack_00000018;
  int *in_stack_00000020;
  char *nullarrayptr;
  char *arrayptr;
  LONGLONG lastcoord [6];
  LONGLONG firstcoord [6];
  LONGLONG dimsize [6];
  LONGLONG last1;
  LONGLONG last0;
  LONGLONG tlast;
  LONGLONG tfirst;
  long inc [6];
  long nplane;
  long nread;
  long naxes [6];
  int planenul;
  int bytesperpixel;
  int ii;
  int naxis;
  undefined4 in_stack_000001b0;
  char *in_stack_000001c0;
  int *in_stack_000001c8;
  int *in_stack_000001d0;
  int *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  fitsfile *in_stack_fffffffffffffe18;
  undefined8 in_stack_fffffffffffffe20;
  int nlen;
  fitsfile *in_stack_fffffffffffffe28;
  long local_1a8;
  long local_198;
  long *local_190;
  LONGLONG *local_188;
  long local_168 [2];
  LONGLONG *in_stack_fffffffffffffea8;
  LONGLONG *in_stack_fffffffffffffeb0;
  long in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  fitsfile *fptr_00;
  long local_130 [4];
  long *in_stack_fffffffffffffef0;
  long *in_stack_fffffffffffffef8;
  long *naxes_00;
  undefined8 in_stack_ffffffffffffff00;
  long lVar1;
  char *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  long *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  LONGLONG *local_b8;
  long local_b0;
  long local_a8 [6];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_5c;
  long local_58;
  long local_50;
  int local_34;
  
  nlen = (int)((ulong)in_stack_fffffffffffffe20 >> 0x20);
  if (*in_stack_00000020 < 1) {
    local_1a8 = in_stack_00000010;
    local_5c = in_R8D;
    local_58 = in_RCX;
    local_50 = in_RDX;
    local_74 = ffpxsz(in_ESI);
    for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
      local_a8[local_70] = 1;
      local_168[local_70] = 0;
      (&local_198)[local_70] = 0;
      *(undefined8 *)(&stack0xffffffffffffff18 + (long)local_70 * 8) = 1;
    }
    ffgidm(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    ffgisz(in_stack_fffffffffffffe28,nlen,(long *)in_stack_fffffffffffffe18,
           in_stack_fffffffffffffe10);
    fptr_00 = (fitsfile *)0x1;
    for (local_70 = 1; local_70 < 6; local_70 = local_70 + 1) {
      local_130[(long)local_70 + -1] =
           local_130[(long)(local_70 + -1) + -1] * local_a8[local_70 + -1];
    }
    array_00 = (void *)(local_50 + -1);
    nullval_00 = (void *)((long)array_00 + local_58 + -1);
    for (local_70 = local_6c + -1; -1 < local_70; local_70 = local_70 + -1) {
      local_168[local_70] = (long)array_00 / local_130[(long)local_70 + -1];
      (&local_198)[local_70] = (long)nullval_00 / local_130[(long)local_70 + -1];
      array_00 = (void *)((long)array_00 - local_168[local_70] * local_130[(long)local_70 + -1]);
      nullval_00 = (void *)((long)nullval_00 -
                           (&local_198)[local_70] * local_130[(long)local_70 + -1]);
    }
    if (local_6c == 1) {
      local_168[0] = local_168[0] + 1;
      local_198 = local_198 + 1;
      fits_read_compressed_img
                ((fitsfile *)naxes[5],naxes[4]._4_4_,(LONGLONG *)naxes[3],(LONGLONG *)naxes[2],
                 (long *)naxes[1],naxes[0]._4_4_,(void *)CONCAT44(datatype,in_stack_000001b0),fptr,
                 in_stack_000001c0,in_stack_000001c8,in_stack_000001d0);
      local_34 = *in_stack_00000020;
    }
    else {
      if (local_6c == 2) {
        fits_read_compressed_img_plane
                  (fptr_00,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                   in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                   (int)in_stack_ffffffffffffff00,nullval_00,array_00,in_stack_ffffffffffffff18,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
      }
      else {
        if (local_6c != 3) {
          ffpmsg((char *)0x1f3200);
          *in_stack_00000020 = 0x19e;
          return 0x19e;
        }
        if ((((local_168[0] == 0) && (local_168[1] == 0)) && (local_198 == local_a8[0] + -1)) &&
           (local_190 == (long *)(local_a8[1] + -1))) {
          for (local_70 = 0; local_70 < 6; local_70 = local_70 + 1) {
            local_168[local_70] = local_168[local_70] + 1;
            (&local_198)[local_70] = (&local_198)[local_70] + 1;
          }
          fits_read_compressed_img
                    ((fitsfile *)naxes[5],naxes[4]._4_4_,(LONGLONG *)naxes[3],(LONGLONG *)naxes[2],
                     (long *)naxes[1],naxes[0]._4_4_,(void *)CONCAT44(datatype,in_stack_000001b0),
                     fptr,in_stack_000001c0,in_stack_000001c8,in_stack_000001d0);
          return *in_stack_00000020;
        }
        if (in_stack_00000018 != (undefined4 *)0x0) {
          *in_stack_00000018 = 0;
        }
        naxes_00 = local_190;
        lVar1 = local_198;
        local_b8 = in_stack_fffffffffffffea8;
        if ((long)in_stack_fffffffffffffea8 < (long)local_188) {
          local_198 = local_a8[0] + -1;
          local_190 = (long *)(local_a8[1] + -1);
        }
        for (; (long)local_b8 <= (long)local_188; local_b8 = (LONGLONG *)((long)local_b8 + 1)) {
          if (local_b8 == local_188) {
            local_198 = lVar1;
            local_190 = naxes_00;
          }
          fits_read_compressed_img_plane
                    (fptr_00,in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                     in_stack_fffffffffffffef0,naxes_00,(int)lVar1,nullval_00,array_00,
                     in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff30);
          if ((local_78 != 0) && (in_stack_00000018 != (undefined4 *)0x0)) {
            *in_stack_00000018 = 1;
          }
          local_168[0] = 0;
          local_168[1] = 0;
          if ((local_1a8 != 0) && (local_5c == 2)) {
            local_1a8 = local_1a8 + local_b0;
          }
        }
      }
      local_34 = *in_stack_00000020;
    }
  }
  else {
    local_34 = *in_stack_00000020;
  }
  return local_34;
}

Assistant:

int fits_read_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer    */
            int  datatype,  /* I - datatype of the array to be returned     */
            LONGLONG   fpixel, /* I - 'first pixel to read          */
            LONGLONG   npixel,  /* I - number of pixels to read      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a consecutive set of pixels from a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to read compressed images in
   general, and could be rather inefficient if the requested pixels to be
   read are located in many different image compression tiles.    

   The general strategy used here is to read the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel, planenul;
    long naxes[MAX_COMPRESS_DIM], nread;
    long nplane, inc[MAX_COMPRESS_DIM];
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    LONGLONG firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr, *nullarrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
        inc[ii] = 1;
    }

    /*  determine the dimensions of the image to be read */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = tfirst / dimsize[ii];
        lastcoord[ii] =  tlast / dimsize[ii];
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just read the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
            nullcheck, nullval, array, nullarray, anynul, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* read 1st (and only) plane of the image */

        fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
          array, nullarray, anynul, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: reading an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can read the contiguous block of pixels in one go */
            fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
                nullcheck, nullval, array, nullarray, anynul, status);

            return(*status);
        }

        if (anynul)
            *anynul = 0;  /* initialize */

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will read up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* read one plane of the cube at a time, for simplicity */
        for (nplane = (long) firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = last0;
                lastcoord[1] = last1;
            }

            fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
              arrayptr, nullarrayptr, &planenul, &nread, status);

            if (planenul && anynul)
               *anynul = 1;  /* there are null pixels */

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be read */
            arrayptr = arrayptr + nread * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + nread;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    return(*status);
}